

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O0

void Omega_h::transfer_common<long>
               (Mesh *old_mesh,Mesh *new_mesh,Int ent_dim,LOs *same_ents2old_ents,
               LOs *same_ents2new_ents,LOs *prods2new_ents,TagBase *tagbase,
               Read<signed_char> *prod_data)

{
  int size_in;
  Write<long> local_e8;
  Read<int> local_d8;
  Read<int> local_c8;
  Write<long> local_b8;
  Read<int> local_a8;
  Read<long> local_98 [2];
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  Write<signed_char> new_data;
  Int ncomps;
  LO nnew_ents;
  LOs *prods2new_ents_local;
  LOs *same_ents2new_ents_local;
  LOs *same_ents2old_ents_local;
  Int ent_dim_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  
  new_data.shared_alloc_.direct_ptr._4_4_ = Mesh::nents(new_mesh,ent_dim);
  new_data.shared_alloc_.direct_ptr._0_4_ = TagBase::ncomps(tagbase);
  size_in = new_data.shared_alloc_.direct_ptr._4_4_ * (Int)new_data.shared_alloc_.direct_ptr;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  Write<long>::Write((Write<long> *)local_50,size_in,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  Read<long>::Read(local_98,(Read<int> *)prod_data);
  Read<int>::Read(&local_a8,prods2new_ents);
  Write<long>::Write(&local_b8,(Write<int> *)local_50);
  map_into<long>((Read<signed_char> *)local_98,&local_a8,(Write<signed_char> *)&local_b8,
                 (Int)new_data.shared_alloc_.direct_ptr);
  Write<long>::~Write(&local_b8);
  Read<int>::~Read(&local_a8);
  Read<long>::~Read(local_98);
  Read<int>::Read(&local_c8,same_ents2old_ents);
  Read<int>::Read(&local_d8,same_ents2new_ents);
  Write<long>::Write(&local_e8,(Write<int> *)local_50);
  transfer_common2<long>
            (old_mesh,new_mesh,ent_dim,&local_c8,&local_d8,tagbase,(Write<signed_char> *)&local_e8);
  Write<long>::~Write(&local_e8);
  Read<int>::~Read(&local_d8);
  Read<int>::~Read(&local_c8);
  Write<long>::~Write((Write<long> *)local_50);
  return;
}

Assistant:

void transfer_common(Mesh* old_mesh, Mesh* new_mesh, Int ent_dim,
    LOs same_ents2old_ents, LOs same_ents2new_ents, LOs prods2new_ents,
    TagBase const* tagbase, Read<T> prod_data) {
  auto nnew_ents = new_mesh->nents(ent_dim);
  auto ncomps = tagbase->ncomps();
  auto new_data = Write<T>(nnew_ents * ncomps);
  map_into(prod_data, prods2new_ents, new_data, ncomps);
  transfer_common2(old_mesh, new_mesh, ent_dim, same_ents2old_ents,
      same_ents2new_ents, tagbase, new_data);
}